

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O3

void Amap_ManMergeNodeCuts(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  void **ppvVar1;
  void *pvVar2;
  void *pvVar3;
  int *piVar4;
  uint uVar5;
  Amap_Cut_t AVar6;
  long lVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  Amap_Cut_t *pAVar11;
  Amap_Cut_t *pCut1;
  int iVar12;
  uint uVar13;
  Amap_Cut_t *pCut0;
  uint uVar14;
  int iVar15;
  Amap_Cut_t *pAVar16;
  uint uVar17;
  
  if (pNode->Fan[0] < 0) {
LAB_00444bad:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar5 = (uint)pNode->Fan[0] >> 1;
  uVar14 = p->vObjs->nSize;
  if ((int)uVar5 < (int)uVar14) {
    if (pNode->Fan[1] < 0) goto LAB_00444bad;
    uVar10 = (uint)pNode->Fan[1] >> 1;
    if (uVar10 < uVar14) {
      if ((pNode->field_11).pData != (void *)0x0) {
        __assert_fail("pNode->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMerge.c"
                      ,0x1c1,"void Amap_ManMergeNodeCuts(Amap_Man_t *, Amap_Obj_t *)");
      }
      ppvVar1 = p->vObjs->pArray;
      pvVar2 = ppvVar1[uVar5];
      pvVar3 = ppvVar1[uVar10];
      if ((*(uint *)pNode & 7) == 4) {
        lVar7 = 0x80;
      }
      else {
        if ((*(uint *)pNode & 7) == 6) {
          Amap_ManMergeNodeCutsMux(p,pNode);
          return;
        }
        lVar7 = 0x88;
      }
      if (0 < *(int *)((long)pvVar2 + 0xc)) {
        lVar7 = *(long *)((long)&p->pLib->pName + lVar7);
        pAVar11 = *(Amap_Cut_t **)((long)pvVar2 + 0x28);
        iVar15 = 0;
        do {
          if (pNode->Fan[0] < 0) {
LAB_00444b6f:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          AVar6 = *pAVar11;
          uVar10 = (uint)AVar6 >> 0x10 & 1;
          uVar5 = pNode->Fan[0] & 1;
          uVar14 = (uVar10 ^ uVar5) + ((uint)AVar6 & 0xffff) * 2;
          if (((uint)AVar6 & 0xffff) == 0) {
            uVar14 = 0;
          }
          if (uVar10 != uVar5 && ((uint)AVar6 & 0xfffe0000) == 0x20000) {
            if ((int)pAVar11[1] < 0) goto LAB_00444b8e;
            pAVar11[1] = (Amap_Cut_t)((uint)pAVar11[1] ^ 1);
          }
          puVar8 = *(uint **)(lVar7 + (ulong)uVar14 * 8);
          uVar9 = *puVar8;
          if (uVar9 != 0) {
            piVar4 = p->pMatsTemp;
            do {
              puVar8 = puVar8 + 1;
              piVar4[uVar9 & 0xffff] = (int)uVar9 >> 0x10;
              uVar9 = *puVar8;
            } while (uVar9 != 0);
          }
          if (0 < *(int *)((long)pvVar3 + 0xc)) {
            pAVar16 = *(Amap_Cut_t **)((long)pvVar3 + 0x28);
            iVar12 = 0;
            do {
              if (pNode->Fan[1] < 0) goto LAB_00444b6f;
              AVar6 = *pAVar16;
              uVar17 = (uint)AVar6 >> 0x10 & 1;
              uVar13 = pNode->Fan[1] & 1;
              uVar9 = (uVar17 ^ uVar13) + ((uint)AVar6 & 0xffff) * 2;
              if (((uint)AVar6 & 0xffff) == 0) {
                uVar9 = 0;
              }
              piVar4 = p->pMatsTemp;
              if (piVar4[uVar9] != 0) {
                if (uVar17 != uVar13 && ((uint)AVar6 & 0xfffe0000) == 0x20000) {
                  if ((int)pAVar16[1] < 0) goto LAB_00444b8e;
                  pAVar16[1] = (Amap_Cut_t)((uint)pAVar16[1] ^ 1);
                }
                pCut1 = pAVar16;
                pCut0 = pAVar11;
                if (uVar14 < uVar9) {
                  pCut1 = pAVar11;
                  pCut0 = pAVar16;
                }
                Amap_ManCutCreate(p,pCut0,pCut1,piVar4[uVar9]);
                AVar6 = *pAVar16;
                if (((uint)AVar6 & 0xfffe0000) == 0x20000 && uVar17 != uVar13) {
                  if ((int)pAVar16[1] < 0) goto LAB_00444b8e;
                  pAVar16[1] = (Amap_Cut_t)((uint)pAVar16[1] ^ 1);
                }
              }
              iVar12 = iVar12 + 1;
              pAVar16 = pAVar16 + (ulong)((uint)AVar6 >> 0x11) + 1;
            } while (iVar12 < *(int *)((long)pvVar3 + 0xc));
          }
          AVar6 = *pAVar11;
          if (((uint)AVar6 & 0xfffe0000) == 0x20000 && uVar10 != uVar5) {
            if ((int)pAVar11[1] < 0) {
LAB_00444b8e:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            pAVar11[1] = (Amap_Cut_t)((uint)pAVar11[1] ^ 1);
          }
          puVar8 = *(uint **)(lVar7 + (ulong)uVar14 * 8);
          uVar14 = *puVar8;
          if (uVar14 != 0) {
            piVar4 = p->pMatsTemp;
            do {
              puVar8 = puVar8 + 1;
              piVar4[uVar14 & 0xffff] = 0;
              uVar14 = *puVar8;
            } while (uVar14 != 0);
            AVar6 = *pAVar11;
          }
          iVar15 = iVar15 + 1;
          pAVar11 = pAVar11 + (ulong)((uint)AVar6 >> 0x11) + 1;
        } while (iVar15 < *(int *)((long)pvVar2 + 0xc));
      }
      Amap_ManCutSaveStored(p,pNode);
      p->nCutsUsed = p->nCutsUsed + pNode->nCuts;
      p->nCutsTried = p->nCutsTried + *(int *)((long)pvVar3 + 0xc) * *(int *)((long)pvVar2 + 0xc);
      if ((pNode->field_0x7 & 0x40) != 0) {
        Amap_ManMergeNodeChoice(p,pNode);
        return;
      }
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Amap_ManMergeNodeCuts( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Cut_t * pCut0, * pCut1;
    int ** pRules, Entry, i, k, c, iCompl0, iCompl1, iFan0, iFan1;
    assert( pNode->pData == NULL );
    if ( pNode->Type == AMAP_OBJ_MUX )
    {
        Amap_ManMergeNodeCutsMux( p, pNode );
        return;
    }
    assert( pNode->Type != AMAP_OBJ_MUX );
    pRules = (pNode->Type == AMAP_OBJ_AND)? p->pLib->pRules: p->pLib->pRulesX;
    Amap_NodeForEachCut( pFanin0, pCut0, c )
    {
        iCompl0 = pCut0->fInv ^ Amap_ObjFaninC0(pNode);
        iFan0   = !pCut0->iMat? 0: Abc_Var2Lit( pCut0->iMat, iCompl0 );
        // complement literals
        if ( pCut0->nFans == 1 && iCompl0 )
            pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
        // label resulting sets
        for ( i = 0; (Entry = pRules[iFan0][i]); i++ )
            p->pMatsTemp[Entry & 0xffff] = (Entry >> 16);
        // iterate through the cuts
        Amap_NodeForEachCut( pFanin1, pCut1, k )
        {
            iCompl1 = pCut1->fInv ^ Amap_ObjFaninC1(pNode);
            iFan1   = !pCut1->iMat? 0: Abc_Var2Lit( pCut1->iMat, iCompl1 );
            if ( p->pMatsTemp[iFan1] == 0 )
                continue;
            // complement literals
            if ( pCut1->nFans == 1 && iCompl1 )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            // create new cut
            if ( iFan0 >= iFan1 )
                Amap_ManCutCreate( p, pCut0, pCut1, p->pMatsTemp[iFan1] );
            else
                Amap_ManCutCreate( p, pCut1, pCut0, p->pMatsTemp[iFan1] );
            // uncomplement literals
            if ( pCut1->nFans == 1 && iCompl1 )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
        }
        // uncomplement literals
        if ( pCut0->nFans == 1 && iCompl0 )
            pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
        // label resulting sets
        for ( i = 0; (Entry = pRules[iFan0][i]); i++ )
            p->pMatsTemp[Entry & 0xffff] = 0;
    }
    Amap_ManCutSaveStored( p, pNode );
    p->nCutsUsed += pNode->nCuts;
    p->nCutsTried += pFanin0->nCuts * pFanin1->nCuts;
//    assert( (int)pNode->nCuts == Amap_ManMergeCountCuts(p, pNode) );
    if ( pNode->fRepr )
        Amap_ManMergeNodeChoice( p, pNode );

//    Amap_ManPrintCuts( pNode );
}